

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O1

bool Fix_Shift_For_Code(short code,bool old_shift)

{
  uint uVar1;
  bool bVar2;
  
  bVar2 = true;
  if (0x19 < (ushort)(code - 0x41U)) {
    if ((ushort)(code - 0x21U) < 0xf) {
      bVar2 = false;
    }
    else {
      bVar2 = false;
      uVar1 = (int)code - 0x5b;
      if (((0x23 < uVar1) || ((0xf0000003fU >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
         (6 < (int)code - 0x3aU)) {
        return old_shift;
      }
    }
  }
  return bVar2;
}

Assistant:

bool
Fix_Shift_For_Code(short code, bool old_shift)
{
  // if uppercase letter, then shift should be true
  if ((code >= 'A') && (code <= 'Z'))
    return true;
  // if a special character, don't allow shift
  else if (((code > ' ') && (code < '0')) || ((code > '9') && (code < 'A')) ||
           ((code > 'Z') && (code < 'a')) || ((code > 'z') && (code <= '~')))
    return false;
  else
    return old_shift;
}